

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivially_serializable.cpp
# Opt level: O2

void __thiscall handlegraph::TriviallySerializable::close_fd(TriviallySerializable *this,int fd)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *this_00;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  iVar1 = close(fd);
  if (iVar1 == 0) {
    return;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_190,"Could not close FD: ");
  pcVar4 = strerror(iVar1);
  std::operator<<(poVar3,pcVar4);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TriviallySerializable::close_fd(int fd) const {
    // Close up the file
    if (::close(fd) != 0) {
        // An error happened closing
        auto problem = errno;
        std::stringstream ss;
        ss << "Could not close FD: " << ::strerror(problem);
        throw std::runtime_error(ss.str());
    }
}